

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O0

int memleak_posix_memalign(void **memptr,size_t alignment,size_t size,char *file,size_t line)

{
  int iVar1;
  char *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  void **in_RDI;
  size_t in_R8;
  int ret;
  
  iVar1 = posix_memalign(in_RDI,(size_t)in_RSI,in_RDX);
  if ((iVar1 == 0) && (start_sw != '\0')) {
    pthread_spin_lock(&lock);
    _memleak_add_to_index(in_RSI,in_RDX,in_RCX,in_R8,'\0');
    pthread_spin_unlock(&lock);
  }
  return iVar1;
}

Assistant:

LIBMEMLEAK_API
int memleak_posix_memalign(void **memptr, size_t alignment, size_t size, char *file, size_t line)
{

    int ret = posix_memalign(memptr, alignment, size);
    if (ret==0 && start_sw)
    {
        spin_lock(&lock);
        _memleak_add_to_index(*memptr, size, file, line, INIT_VAL);
        spin_unlock(&lock);
    }

    return ret;
}